

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_archive.cpp
# Opt level: O3

bool __thiscall ON_BinaryArchive::ReadArray(ON_BinaryArchive *this,ON_SimpleArray<ON_Xform> *a)

{
  bool bVar1;
  bool bVar2;
  ON_Xform *p;
  int iVar3;
  int count;
  uint local_1c;
  
  if (a->m_a != (ON_Xform *)0x0) {
    memset(a->m_a,0,(long)a->m_capacity << 7);
  }
  a->m_count = 0;
  local_1c = 0;
  bVar2 = ReadInt32(this,1,(ON__INT32 *)&local_1c);
  if (0 < (int)local_1c && bVar2) {
    ON_SimpleArray<ON_Xform>::SetCapacity(a,(ulong)local_1c);
    if ((int)local_1c < 1) {
      bVar2 = true;
    }
    else {
      iVar3 = 1;
      do {
        p = ON_SimpleArray<ON_Xform>::AppendNew(a);
        bVar2 = ReadDouble(this,0x10,(double *)p);
        if (!bVar2) {
          return bVar2;
        }
        bVar1 = iVar3 < (int)local_1c;
        iVar3 = iVar3 + 1;
      } while (bVar1);
    }
  }
  return bVar2;
}

Assistant:

bool
ON_BinaryArchive::ReadArray( ON_SimpleArray<ON_Xform>& a )
{
  a.Empty();
  int count = 0;
  bool rc = ReadInt( &count );
  if ( rc && count > 0 ) 
  {
    a.SetCapacity( count );
    int i;
    for ( i = 0; i < count && rc; i++ )
    {
      rc = ReadXform(a.AppendNew());
    }
  }
  return rc;
}